

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfd.h
# Opt level: O0

void __thiscall pfd::settings::settings(settings *this,bool resync)

{
  byte bVar1;
  bool bVar2;
  bool *pbVar3;
  byte in_SIL;
  char *desktop_name;
  undefined4 in_stack_fffffffffffffe38;
  flag in_stack_fffffffffffffe3c;
  undefined6 in_stack_fffffffffffffe40;
  byte in_stack_fffffffffffffe46;
  undefined1 in_stack_fffffffffffffe47;
  byte local_1a3;
  bool local_189;
  allocator local_111;
  string local_110 [37];
  byte local_eb;
  byte local_ea;
  allocator local_e9;
  string local_e8 [32];
  char *local_c8;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [16];
  string *in_stack_ffffffffffffffa8;
  settings *in_stack_ffffffffffffffb0;
  allocator local_31;
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  bVar1 = local_9 ^ 0xff;
  pbVar3 = flags((settings *)
                 CONCAT17(in_stack_fffffffffffffe47,
                          CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                 in_stack_fffffffffffffe3c);
  *pbVar3 = (*pbVar3 & 1U & bVar1 & 1) != 0;
  pbVar3 = flags((settings *)
                 CONCAT17(in_stack_fffffffffffffe47,
                          CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                 in_stack_fffffffffffffe3c);
  if ((*pbVar3 & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"zenity",&local_31);
    bVar2 = check_program(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    pbVar3 = flags((settings *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                   in_stack_fffffffffffffe3c);
    *pbVar3 = bVar2;
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"matedialog",&local_69);
    bVar2 = check_program(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    pbVar3 = flags((settings *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                   in_stack_fffffffffffffe3c);
    *pbVar3 = bVar2;
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"qarma",&local_91);
    bVar2 = check_program(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    pbVar3 = flags((settings *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                   in_stack_fffffffffffffe3c);
    *pbVar3 = bVar2;
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"kdialog",&local_b9);
    bVar2 = check_program(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    pbVar3 = flags((settings *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                   in_stack_fffffffffffffe3c);
    *pbVar3 = bVar2;
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    pbVar3 = flags((settings *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                   in_stack_fffffffffffffe3c);
    if (((*pbVar3 & 1U) != 0) &&
       (pbVar3 = flags((settings *)
                       CONCAT17(in_stack_fffffffffffffe47,
                                CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                       in_stack_fffffffffffffe3c), (*pbVar3 & 1U) != 0)) {
      local_c8 = getenv("XDG_SESSION_DESKTOP");
      local_ea = 0;
      local_eb = 0;
      local_189 = false;
      if (local_c8 != (char *)0x0) {
        std::allocator<char>::allocator();
        local_ea = 1;
        std::__cxx11::string::string(local_e8,"gnome",&local_e9);
        local_eb = 1;
        local_189 = std::operator==((char *)CONCAT17(in_stack_fffffffffffffe47,
                                                     CONCAT16(in_stack_fffffffffffffe46,
                                                              in_stack_fffffffffffffe40)),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                                   );
      }
      if ((local_eb & 1) != 0) {
        std::__cxx11::string::~string(local_e8);
      }
      if ((local_ea & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      }
      if (local_189 == false) {
        local_1a3 = 0;
        if (local_c8 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_110,"KDE",&local_111);
          local_1a3 = std::operator==((char *)CONCAT17(in_stack_fffffffffffffe47,
                                                       CONCAT16(in_stack_fffffffffffffe46,
                                                                in_stack_fffffffffffffe40)),
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffe3c,
                                                  in_stack_fffffffffffffe38));
          in_stack_fffffffffffffe47 = local_1a3;
          std::__cxx11::string::~string(local_110);
          std::allocator<char>::~allocator((allocator<char> *)&local_111);
        }
        in_stack_fffffffffffffe46 = local_1a3;
        if ((local_1a3 & 1) != 0) {
          pbVar3 = flags((settings *)
                         CONCAT17(in_stack_fffffffffffffe47,
                                  CONCAT16(local_1a3,in_stack_fffffffffffffe40)),
                         in_stack_fffffffffffffe3c);
          *pbVar3 = false;
          in_stack_fffffffffffffe46 = local_1a3;
        }
      }
      else {
        pbVar3 = flags((settings *)
                       CONCAT17(in_stack_fffffffffffffe47,
                                CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                       in_stack_fffffffffffffe3c);
        *pbVar3 = false;
      }
    }
    pbVar3 = flags((settings *)
                   CONCAT17(in_stack_fffffffffffffe47,
                            CONCAT16(in_stack_fffffffffffffe46,in_stack_fffffffffffffe40)),
                   in_stack_fffffffffffffe3c);
    *pbVar3 = true;
  }
  return;
}

Assistant:

inline settings::settings(bool resync)
{
    flags(flag::is_scanned) &= !resync;

    if (flags(flag::is_scanned))
        return;

#if _WIN32
    flags(flag::is_vista) = internal::is_vista();
#elif !__APPLE__
    flags(flag::has_zenity) = check_program("zenity");
    flags(flag::has_matedialog) = check_program("matedialog");
    flags(flag::has_qarma) = check_program("qarma");
    flags(flag::has_kdialog) = check_program("kdialog");

    // If multiple helpers are available, try to default to the best one
    if (flags(flag::has_zenity) && flags(flag::has_kdialog))
    {
        auto desktop_name = std::getenv("XDG_SESSION_DESKTOP");
        if (desktop_name && desktop_name == std::string("gnome"))
            flags(flag::has_kdialog) = false;
        else if (desktop_name && desktop_name == std::string("KDE"))
            flags(flag::has_zenity) = false;
    }
#endif

    flags(flag::is_scanned) = true;
}